

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O2

bool __thiscall
ctemplate::SectionTemplateNode::AddTemplateNode
          (SectionTemplateNode *this,TemplateToken *token,Template *my_template,string *indentation)

{
  TemplateTemplateNode *this_00;
  TemplateTemplateNode *local_30;
  
  if (token != (TemplateToken *)0x0) {
    this_00 = (TemplateTemplateNode *)operator_new(0x80);
    TemplateTemplateNode::TemplateTemplateNode(this_00,token,my_template->strip_,indentation);
    local_30 = this_00;
    std::__cxx11::list<ctemplate::TemplateNode_*,_std::allocator<ctemplate::TemplateNode_*>_>::
    push_back(&this->node_list_,(value_type *)&local_30);
    return true;
  }
  __assert_fail("token",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template.cc"
                ,0x68d,
                "bool ctemplate::SectionTemplateNode::AddTemplateNode(TemplateToken *, Template *, const string &)"
               );
}

Assistant:

bool SectionTemplateNode::AddTemplateNode(TemplateToken* token,
                                          Template* my_template,
                                          const string& indentation) {
  assert(token);
  bool success = true;
  node_list_.push_back(
      new TemplateTemplateNode(*token, my_template->strip_, indentation));
  return success;
}